

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FICDATADecoder::decode(FICDATADecoder *this,uint8_t *data,size_t len)

{
  uint8_t *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar1;
  string local_58;
  undefined1 local_38 [24];
  size_t len_local;
  uint8_t *data_local;
  FICDATADecoder *this_local;
  
  len_local = len;
  data_local = data;
  this_local = this;
  parseUTF8String_abi_cxx11_(&local_58,(Assimp *)len,in_RCX,(size_t)in_RCX);
  FICDATAValue::create((FICDATAValue *)local_38,&local_58);
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FICDATAValue,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,(shared_ptr<Assimp::FICDATAValue> *)local_38)
  ;
  std::shared_ptr<Assimp::FICDATAValue>::~shared_ptr((shared_ptr<Assimp::FICDATAValue> *)local_38);
  std::__cxx11::string::~string((string *)&local_58);
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FICDATAValue::create(parseUTF8String(data, len));
    }